

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFile.cpp
# Opt level: O2

void __thiscall blc::tools::VFile::VFile(VFile *this,VFile *vFile)

{
  (this->super_stream)._vptr_stream = (_func_int **)&PTR_write_0011acc0;
  std::fstream::fstream(&this->_file,(string *)&vFile->_fileName,_S_out|_S_in);
  (this->_cache)._M_dataplus._M_p = (pointer)&(this->_cache).field_2;
  (this->_cache)._M_string_length = 0;
  (this->_cache).field_2._M_local_buf[0] = '\0';
  (this->_fileName)._M_dataplus._M_p = (pointer)&(this->_fileName).field_2;
  (this->_fileName)._M_string_length = 0;
  (this->_fileName).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->_fileName);
  refresh(this);
  return;
}

Assistant:

blc::tools::VFile::VFile(VFile&& vFile) : _file(vFile._fileName) {
	this->_fileName = vFile._fileName;
	this->refresh();
}